

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void lower_bound_sorted_suite::find_odd_first(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  array<int,_5UL> storage;
  int *local_38;
  int *local_30;
  int local_28 [6];
  
  local_30 = local_28;
  local_28[0] = 0xb;
  local_28[1] = 0x16;
  local_28[2] = 0x21;
  local_28[3] = 0x2c;
  local_28[4] = 0x37;
  uVar1 = 5;
  do {
    uVar2 = uVar1 >> 1;
    uVar3 = uVar2;
    if (9 < local_30[uVar2]) {
      uVar3 = 0;
    }
    local_30 = local_30 + uVar3;
    uVar1 = uVar1 - uVar2;
  } while (1 < (long)uVar1);
  local_30 = local_30 + (*local_30 < 10);
  piVar4 = local_28;
  local_38 = piVar4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 10)","storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3fe,"void lower_bound_sorted_suite::find_odd_first()",&local_30,&local_38);
  uVar1 = 5;
  do {
    uVar2 = uVar1 >> 1;
    uVar3 = uVar2;
    if (10 < piVar4[uVar2]) {
      uVar3 = 0;
    }
    piVar4 = piVar4 + uVar3;
    uVar1 = uVar1 - uVar2;
  } while (1 < (long)uVar1);
  local_30 = piVar4 + (*piVar4 < 0xb);
  piVar4 = local_28;
  local_38 = piVar4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 11)","storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x400,"void lower_bound_sorted_suite::find_odd_first()",&local_30,&local_38);
  uVar1 = 5;
  do {
    uVar2 = uVar1 >> 1;
    uVar3 = uVar2;
    if (0xb < piVar4[uVar2]) {
      uVar3 = 0;
    }
    piVar4 = piVar4 + uVar3;
    uVar1 = uVar1 - uVar2;
  } while (1 < (long)uVar1);
  local_30 = piVar4 + (*piVar4 < 0xc);
  local_38 = local_28 + 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 12)",
             "std::next(storage.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x402,"void lower_bound_sorted_suite::find_odd_first()",&local_30,&local_38);
  return;
}

Assistant:

void find_odd_first()
{
    std::array<int, 5> storage = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 10),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 11),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 12),
                  std::next(storage.begin(), 1));
}